

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
::write_double<long_double>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
           *this,longdouble value,format_specs *spec)

{
  undefined4 uVar1;
  bool bVar2;
  alignment aVar3;
  align_spec *spec_00;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *this_00;
  align_spec *in_RSI;
  longdouble in_stack_00000008;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  bool use_grisu;
  memory_buffer buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler handler;
  float_spec_handler *in_stack_fffffffffffffcc8;
  allocator<char> *alloc;
  value_type *__value;
  undefined2 uVar4;
  undefined5 in_stack_fffffffffffffcd2;
  char in_stack_fffffffffffffcd7;
  char *in_stack_fffffffffffffcd8;
  write_inf_or_nan_t *in_stack_fffffffffffffce0;
  undefined2 in_stack_fffffffffffffce8;
  char local_2f9;
  buffer *in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd21;
  undefined2 in_stack_fffffffffffffd28;
  core_format_specs in_stack_fffffffffffffd30;
  alignment aVar5;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
  *this_01;
  undefined4 uStack_28c;
  undefined1 uStack_288;
  undefined2 uStack_286;
  allocator<char> local_261;
  basic_buffer<char> local_260 [17];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined2 local_30;
  char local_2c;
  char local_23;
  float_spec_handler local_22;
  align_spec *local_20;
  longdouble local_18;
  
  local_18 = in_stack_00000008;
  local_20 = in_RSI;
  float_spec_handler::float_spec_handler(&local_22,*(char *)((long)&in_RSI[1].fill_ + 1));
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>
            (in_stack_fffffffffffffcd7,in_stack_fffffffffffffcc8);
  local_23 = '\0';
  bVar2 = std::signbit(local_18);
  if (bVar2) {
    local_23 = '-';
    local_18 = -local_18;
  }
  else {
    bVar2 = core_format_specs::has((core_format_specs *)(local_20 + 1),1);
    if (bVar2) {
      bVar2 = core_format_specs::has((core_format_specs *)(local_20 + 1),2);
      local_2f9 = '+';
      if (!bVar2) {
        local_2f9 = ' ';
      }
      local_23 = local_2f9;
    }
  }
  local_30 = (undefined2)local_20[1].fill_;
  local_40._0_4_ = local_20->width_;
  local_40._4_4_ = local_20->fill_;
  uStack_38 = *(undefined8 *)&local_20->align_;
  local_2c = local_23;
  bVar2 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<long_double>
                    ((longdouble)CONCAT28(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0));
  if (bVar2) {
    write_double<long_double>::write_inf_or_nan_t::operator()
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  else {
    alloc = SUB108(local_18,0);
    uVar4 = (undefined2)((unkuint10)local_18 >> 0x40);
    bVar2 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<long_double>
                      ((longdouble)CONCAT28(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0));
    if (bVar2) {
      write_double<long_double>::write_inf_or_nan_t::operator()
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,CONCAT52(in_stack_fffffffffffffcd2,uVar4)),alloc
                );
      std::allocator<char>::~allocator(&local_261);
      uStack_288 = (undefined1)local_20[1].fill_;
      uStack_286 = (undefined2)((uint)local_20[1].fill_ >> 0x10);
      uStack_28c = (undefined4)((ulong)*(undefined8 *)&local_20->align_ >> 0x20);
      this_01 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
                 *)CONCAT26(uStack_286,CONCAT15(local_22.type,CONCAT14(uStack_288,uStack_28c)));
      __value = SUB108(local_18,0);
      uVar4 = (undefined2)((unkuint10)local_18 >> 0x40);
      internal::sprintf_format<long_double>
                ((longdouble)
                 CONCAT28(in_stack_fffffffffffffd28,
                          CONCAT71(in_stack_fffffffffffffd21,in_stack_fffffffffffffd20)),
                 in_stack_fffffffffffffd18,in_stack_fffffffffffffd30);
      spec_00 = (align_spec *)internal::basic_buffer<char>::size(local_260);
      uVar1 = local_20->fill_;
      aVar5 = local_20->align_;
      aVar3 = align_spec::align(local_20);
      if (aVar3 == ALIGN_NUMERIC) {
        if (local_23 != '\0') {
          this_00 = reserve((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
                             *)CONCAT17(in_stack_fffffffffffffcd7,
                                        CONCAT52(in_stack_fffffffffffffcd2,uVar4)),(size_t)__value);
          std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>::operator++
                    (this_00,0);
          std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>::operator*
                    ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)
                     &stack0xfffffffffffffd30);
          std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>::operator=
                    ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)
                     CONCAT17(in_stack_fffffffffffffcd7,CONCAT52(in_stack_fffffffffffffcd2,uVar4)),
                     __value);
          local_23 = '\0';
        }
        aVar5 = ALIGN_RIGHT;
      }
      else {
        aVar3 = align_spec::align(local_20);
        if (aVar3 == ALIGN_DEFAULT) {
          aVar5 = ALIGN_RIGHT;
        }
        if (local_23 != '\0') {
          spec_00 = (align_spec *)((long)&spec_00->width_ + 1);
        }
      }
      basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
      ::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::double_writer>
                (this_01,spec_00,(double_writer *)CONCAT44(aVar5,uVar1));
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,CONCAT52(in_stack_fffffffffffffcd2,uVar4)));
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}